

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

cmNinjaRule *
anon_unknown.dwarf_e6d911::GetScanRule
          (cmNinjaRule *__return_storage_ptr__,string *ruleName,string *ppFileName,string *deptype,
          RuleVariables *vars,string *responseFlag,string *flags,
          cmRulePlaceholderExpander *rulePlaceholderExpander,cmLocalNinjaGenerator *generator,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          scanCmds,string *outputConfig)

{
  string *psVar1;
  cmNinjaRule *pcVar2;
  char *pcVar3;
  bool bVar4;
  cmOutputConverter *outputConverter;
  string *scanCmd;
  string *s;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  char local_252 [2];
  cmNinjaRule *local_250;
  string scanFlags;
  undefined1 local_228 [48];
  string local_1f8;
  undefined1 local_1d8 [48];
  string local_1a8;
  RuleVariables local_188;
  
  std::__cxx11::string::string((string *)&local_1a8,(string *)ruleName);
  cmNinjaRule::cmNinjaRule(__return_storage_ptr__,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  __y._M_str = "msvc";
  __y._M_len = 4;
  __x._M_str = (deptype->_M_dataplus)._M_p;
  __x._M_len = deptype->_M_string_length;
  bVar4 = std::operator==(__x,__y);
  local_250 = __return_storage_ptr__;
  if (bVar4) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->DepType);
  }
  else {
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->DepType);
  }
  std::__cxx11::string::assign((char *)&local_250->DepFile);
  memset(&local_188.TargetPDB,0,0x140);
  local_188.CMTargetName = vars->CMTargetName;
  local_188.CMTargetType = vars->CMTargetType;
  local_188.Language = vars->Language;
  local_188.Object = "$OBJ_FILE";
  local_188.PreprocessedSource = (ppFileName->_M_dataplus)._M_p;
  local_188.DynDepFile = "$DYNDEP_INTERMEDIATE_FILE";
  local_188.DependencyFile = (local_250->DepFile)._M_dataplus._M_p;
  local_188.DependencyTarget = "$out";
  local_188.Source = vars->Source;
  local_188.Defines = vars->Defines;
  local_188.Includes = vars->Includes;
  std::__cxx11::string::string((string *)&scanFlags,(string *)flags);
  if (responseFlag->_M_string_length != 0) {
    std::__cxx11::string::assign((char *)&local_250->RspFile);
    pcVar3 = local_188.Defines;
    local_1d8._8_8_ = local_1d8 + 0x10;
    local_1d8._0_8_ = (pointer)0x1;
    local_1d8[0x10] = ' ';
    local_228._0_8_ = strlen(local_188.Defines);
    local_228._8_8_ = pcVar3;
    local_252[1] = 0x20;
    local_252[0] = ' ';
    cmStrCat<char,char_const*,char,std::__cxx11::string>
              (&local_1f8,(cmAlphaNum *)local_1d8,(cmAlphaNum *)local_228,local_252 + 1,
               &local_188.Includes,local_252,&scanFlags);
    pcVar2 = local_250;
    std::__cxx11::string::operator=((string *)&local_250->RspContent,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    local_1d8._8_8_ = (responseFlag->_M_dataplus)._M_p;
    local_1d8._0_8_ = responseFlag->_M_string_length;
    local_228._8_8_ = (pcVar2->RspFile)._M_dataplus._M_p;
    local_228._0_8_ = (pcVar2->RspFile)._M_string_length;
    cmStrCat<>(&local_1f8,(cmAlphaNum *)local_1d8,(cmAlphaNum *)local_228);
    std::__cxx11::string::operator=((string *)&scanFlags,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    local_188.Defines = "";
    local_188.Includes = "";
  }
  local_188.Flags = scanFlags._M_dataplus._M_p;
  s = (string *)
      ((scanCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  psVar1 = (string *)
           (scanCmds.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  outputConverter =
       &(generator->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (generator == (cmLocalNinjaGenerator *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  for (; s != psVar1; s = s + 1) {
    cmRulePlaceholderExpander::ExpandRuleVariables
              (rulePlaceholderExpander,outputConverter,s,&local_188);
  }
  local_228._0_8_ = local_228 + 0x10;
  local_228._8_8_ = (char *)0x0;
  local_228[0x10] = '\0';
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_1d8,generator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)scanCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
             scanCmds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             scanCmds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,(string *)local_228,(cmGeneratorTarget *)0x0
            );
  pcVar2 = local_250;
  std::__cxx11::string::operator=((string *)&local_250->Command,(string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)&scanFlags);
  return pcVar2;
}

Assistant:

cmNinjaRule GetScanRule(
  std::string const& ruleName, std::string const& ppFileName,
  std::string const& deptype,
  cmRulePlaceholderExpander::RuleVariables const& vars,
  const std::string& responseFlag, const std::string& flags,
  cmRulePlaceholderExpander* const rulePlaceholderExpander,
  cmLocalNinjaGenerator* generator, std::vector<std::string> scanCmds,
  const std::string& outputConfig)
{
  cmNinjaRule rule(ruleName);
  // Scanning always uses a depfile for preprocessor dependencies.
  if (deptype == "msvc"_s) {
    rule.DepType = deptype;
    rule.DepFile = "";
  } else {
    rule.DepType = ""; // no deps= for multiple outputs
    rule.DepFile = "$DEP_FILE";
  }

  cmRulePlaceholderExpander::RuleVariables scanVars;
  scanVars.CMTargetName = vars.CMTargetName;
  scanVars.CMTargetType = vars.CMTargetType;
  scanVars.Language = vars.Language;
  scanVars.Object = "$OBJ_FILE";
  scanVars.PreprocessedSource = ppFileName.c_str();
  scanVars.DynDepFile = "$DYNDEP_INTERMEDIATE_FILE";
  scanVars.DependencyFile = rule.DepFile.c_str();
  scanVars.DependencyTarget = "$out";

  // Scanning needs the same preprocessor settings as direct compilation would.
  scanVars.Source = vars.Source;
  scanVars.Defines = vars.Defines;
  scanVars.Includes = vars.Includes;

  // Scanning needs the compilation flags too.
  std::string scanFlags = flags;

  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent =
      cmStrCat(' ', scanVars.Defines, ' ', scanVars.Includes, ' ', scanFlags);
    scanFlags = cmStrCat(responseFlag, rule.RspFile);
    scanVars.Defines = "";
    scanVars.Includes = "";
  }

  scanVars.Flags = scanFlags.c_str();

  // Rule for scanning a source file.
  for (std::string& scanCmd : scanCmds) {
    rulePlaceholderExpander->ExpandRuleVariables(generator, scanCmd, scanVars);
  }
  rule.Command =
    generator->BuildCommandLine(scanCmds, outputConfig, outputConfig);

  return rule;
}